

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLinOp::AnyAverageDownAndSync
          (MLNodeLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int iVar1;
  CpOp op;
  MFInfo *info;
  MLLinOp *in_RDI;
  MultiFab tmpmf;
  int rr;
  MultiFab *cmf;
  MultiFab *fmf;
  int falev;
  int finest_amr_lev;
  int ncomp;
  size_type in_stack_fffffffffffffd58;
  int amr_lev;
  Periodicity *pPVar2;
  MLLinOp *in_stack_fffffffffffffd60;
  Periodicity *in_stack_fffffffffffffd70;
  BoxArray *in_stack_fffffffffffffd78;
  MultiFab *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  MLNodeLinOp *in_stack_fffffffffffffd90;
  MLNodeLinOp *this_00;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdac;
  FabFactory<amrex::FArrayBox> *factory;
  MultiFab *S_crse;
  MultiFab *S_fine;
  int local_34;
  MLLinOp *local_30;
  FabArrayBase *local_28;
  CpOp local_1c;
  CpOp local_18;
  int local_14;
  
  local_14 = (*in_RDI->_vptr_MLLinOp[5])();
  iVar1 = MLLinOp::NAMRLevels(in_RDI);
  op = iVar1 - ADD;
  local_18 = op;
  Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
            ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffd78);
  nodalSync(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,
            in_stack_fffffffffffffd80);
  for (local_1c = local_18; iVar1 = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
      0 < (int)local_1c; local_1c = local_1c - ADD) {
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    local_28 = (FabArrayBase *)Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffd78);
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    amr_lev = (int)(in_stack_fffffffffffffd58 >> 0x20);
    local_30 = (MLLinOp *)Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffd78);
    local_34 = MLLinOp::AMRRefRatio(in_stack_fffffffffffffd60,amr_lev);
    FabArrayBase::boxArray(local_28);
    in_stack_fffffffffffffd78 = (BoxArray *)&stack0xfffffffffffffde0;
    amrex::coarsen(in_stack_fffffffffffffd78,iVar1);
    info = (MFInfo *)FabArrayBase::DistributionMap(local_28);
    S_crse = (MultiFab *)0x0;
    S_fine = (MultiFab *)0x0;
    this_00 = (MLNodeLinOp *)&stack0xfffffffffffffdb8;
    iVar1 = local_14;
    MFInfo::MFInfo((MFInfo *)0x168c5c2);
    factory = (FabFactory<amrex::FArrayBox> *)0x0;
    pPVar2 = (Periodicity *)&stack0xfffffffffffffdb0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd70 = pPVar2;
    MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_fffffffffffffda4,op),(BoxArray *)in_RDI,
                       (DistributionMapping *)this_00,iVar1,in_stack_fffffffffffffd88,info,factory);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x168c614);
    MFInfo::~MFInfo((MFInfo *)0x168c61e);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffd60);
    average_down(S_fine,S_crse,(int)((ulong)factory >> 0x20),(int)factory,in_stack_fffffffffffffdac)
    ;
    in_stack_fffffffffffffd60 = local_30;
    Periodicity::NonPeriodic();
    in_stack_fffffffffffffd58 = (ulong)pPVar2 & 0xffffffff00000000;
    FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)this_00,
               (FabArray<amrex::FArrayBox> *)CONCAT44(iVar1,in_stack_fffffffffffffd88),
               (int)((ulong)info >> 0x20),(int)info,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               in_stack_fffffffffffffd70,op);
    nodalSync(this_00,iVar1,in_stack_fffffffffffffd88,(MultiFab *)info);
    MultiFab::~MultiFab((MultiFab *)0x168c6c5);
  }
  return;
}

Assistant:

void
MLNodeLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    const int ncomp = getNComp();
    const int finest_amr_lev = NAMRLevels() - 1;

    nodalSync(finest_amr_lev, 0, sol[finest_amr_lev].get<MultiFab>());

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        const auto& fmf = sol[falev  ].get<MultiFab>();
        auto&       cmf = sol[falev-1].get<MultiFab>();

        auto rr = AMRRefRatio(falev-1);
        MultiFab tmpmf(amrex::coarsen(fmf.boxArray(), rr), fmf.DistributionMap(), ncomp, 0);
        amrex::average_down(fmf, tmpmf, 0, ncomp, rr);
        cmf.ParallelCopy(tmpmf, 0, 0, ncomp);
        nodalSync(falev-1, 0, cmf);
    }
}